

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu.cpp
# Opt level: O2

int __thiscall ncnn::PReLU::load_model(PReLU *this,ModelBin *mb)

{
  int iVar1;
  Mat MStack_48;
  
  (**mb->_vptr_ModelBin)(&MStack_48,mb,(ulong)(uint)this->num_slope,1);
  Mat::operator=(&this->slope_data,&MStack_48);
  Mat::~Mat(&MStack_48);
  if (((this->slope_data).data == (void *)0x0) ||
     (iVar1 = 0, (long)(this->slope_data).c * (this->slope_data).cstep == 0)) {
    iVar1 = -100;
  }
  return iVar1;
}

Assistant:

int PReLU::load_model(const ModelBin& mb)
{
    slope_data = mb.load(num_slope, 1);
    if (slope_data.empty())
        return -100;

    return 0;
}